

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O0

void __thiscall
TPZEquationFilter::ScatterInternal<double>
          (TPZEquationFilter *this,TPZFMatrix<double> *vsmall,TPZFMatrix<double> *vexpand)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  double *pdVar5;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<double> *in_RDI;
  double extraout_XMM0_Qa;
  int64_t i;
  int j;
  int64_t ncols;
  int64_t neqcondense;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  TPZEquationFilter *in_stack_ffffffffffffffa8;
  TPZFMatrix<double> *in_stack_ffffffffffffffc8;
  long index;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  
  iVar2 = NActiveEquations(in_stack_ffffffffffffffa8);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if (iVar3 == iVar2) {
    iVar3 = TPZBaseMatrix::Rows(in_RDX);
    if (iVar3 == (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) {
      iVar3 = TPZBaseMatrix::Cols(in_RSI);
      iVar4 = TPZBaseMatrix::Cols(in_RDX);
      if (iVar3 <= iVar4) goto LAB_01e00e4a;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) const [TVar = double]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Incompatible dimensions\nAborting...\n");
  pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
LAB_01e00e4a:
  bVar1 = IsActive((TPZEquationFilter *)in_RDI);
  if (bVar1) {
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xf])();
    iVar3 = TPZBaseMatrix::Cols(in_RSI);
    for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
      for (index = 0; index < iVar2; index = index + 1) {
        (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RSI,index,(long)iVar6);
        TPZVec<long>::operator[]
                  ((TPZVec<long> *)
                   &(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed,index);
        pdVar5 = TPZFMatrix<double>::operator()
                           ((TPZFMatrix<double> *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),index,
                            (int64_t)in_RDI);
        *pdVar5 = extraout_XMM0_Qa;
      }
    }
  }
  else {
    TPZFMatrix<double>::operator=(in_stack_ffffffffffffffc8,in_RDI);
  }
  return;
}

Assistant:

void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &vsmall,
                     TPZFMatrix<TVar> &vexpand) const {
  int64_t neqcondense = this->NActiveEquations();
  if (vsmall.Rows() != neqcondense || vexpand.Rows() != fNumEq ||
      vsmall.Cols() > vexpand.Cols()) {
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Incompatible dimensions\nAborting...\n";
    DebugStop();
  }
  if (!IsActive()) {
    vexpand = vsmall;
    return;
  }
  vexpand.Zero();

#ifdef PZDEBUG
  {
    for (int64_t i = 0; i < neqcondense; i++) {
      if (fActiveEqs[i] >= fNumEq) {
        DebugStop();
      }
    }
  }
#endif
  const auto ncols = vsmall.Cols();
  for(auto j = 0; j < ncols; j++)
    for (int64_t i = 0; i < neqcondense; i++)
      vexpand(fActiveEqs[i], j) = vsmall.GetVal(i, j);
}